

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int main(void)

{
  int iVar1;
  nn_trie trie;
  nn_trie local_10;
  
  local_10.root = (nn_trie_node *)0x0;
  iVar1 = nn_trie_match(&local_10,"",0);
  if (iVar1 == 0) {
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 != 0) goto LAB_00103a24;
    nn_node_term((nn_trie_node *)0x0);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,"",0);
    if (iVar1 == 0) goto LAB_00103a29;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 == 0) goto LAB_00103a2e;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a33;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a38;
    iVar1 = nn_trie_match(&local_10,"DEF",3);
    if (iVar1 != 0) goto LAB_00103a3d;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103a42;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a47;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDE",5);
    if (iVar1 == 0) goto LAB_00103a4c;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_00103a51;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_00103a56;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012456789",10);
    if (iVar1 != 0) goto LAB_00103a5b;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012345678901234567",0x12);
    if (iVar1 != 0) goto LAB_00103a60;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_00103a65;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a6a;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ADE",3);
    if (iVar1 == 0) goto LAB_00103a6f;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_00103a74;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AD",2);
    if (iVar1 != 0) goto LAB_00103a79;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103a7e;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_00103a83;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_00103a88;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103a8d;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_00103a92;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_00103a97;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_00103a9c;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_00103aa1;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_00103aa6;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103aab;
    iVar1 = nn_trie_match(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103ab0;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103ab5;
    iVar1 = nn_trie_match(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103aba;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"000",3);
    if (iVar1 == 0) goto LAB_00103abf;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"a",1);
    if (iVar1 != 0) goto LAB_00103ac4;
    iVar1 = nn_trie_match(&local_10,"c",1);
    if (iVar1 != 0) goto LAB_00103ac9;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 == 0) goto LAB_00103ace;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"AB",2);
    if (iVar1 == 0) goto LAB_00103ad3;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"AB",2);
    if (iVar1 != 1) goto LAB_00103ad8;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103add;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDEF",6);
    if (iVar1 == 0) goto LAB_00103ae2;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_00103ae7;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"ABCD",4);
    if (iVar1 != 1) goto LAB_00103aec;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 != 0) goto LAB_00103af1;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_00103af6;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103afb;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_00103b00;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_00103b05;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_00103b0a;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103b0f;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_00103b14;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_00103b19;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103b1e;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_00103b23;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_00103b28;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_00103b2d;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_00103b32;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_00103b37;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103b3c;
    iVar1 = nn_node_unsubscribe(&local_10.root,"0",1);
    if (iVar1 != 1) goto LAB_00103b41;
    iVar1 = nn_node_unsubscribe(&local_10.root,"f",1);
    if (iVar1 != 1) goto LAB_00103b46;
    iVar1 = nn_node_unsubscribe(&local_10.root,"E",1);
    if (iVar1 != 1) goto LAB_00103b4b;
    iVar1 = nn_node_unsubscribe(&local_10.root,"B",1);
    if (iVar1 != 1) goto LAB_00103b50;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_00103b55;
    iVar1 = nn_node_unsubscribe(&local_10.root,"1",1);
    if (iVar1 != 1) goto LAB_00103b5a;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"@",1);
    if (iVar1 != 1) goto LAB_00103b5f;
    iVar1 = nn_node_unsubscribe(&local_10.root,"F",1);
    if (iVar1 != 1) goto LAB_00103b64;
    iVar1 = nn_node_unsubscribe(&local_10.root,"C",1);
    if (iVar1 == 1) {
      iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"b",1);
      if (iVar1 == 1) {
        nn_node_term(local_10.root);
        return 0;
      }
      goto LAB_00103b6e;
    }
  }
  else {
    main_cold_1();
LAB_00103a24:
    main_cold_2();
LAB_00103a29:
    main_cold_68();
LAB_00103a2e:
    main_cold_67();
LAB_00103a33:
    main_cold_66();
LAB_00103a38:
    main_cold_65();
LAB_00103a3d:
    main_cold_3();
LAB_00103a42:
    main_cold_4();
LAB_00103a47:
    main_cold_64();
LAB_00103a4c:
    main_cold_63();
LAB_00103a51:
    main_cold_62();
LAB_00103a56:
    main_cold_5();
LAB_00103a5b:
    main_cold_6();
LAB_00103a60:
    main_cold_7();
LAB_00103a65:
    main_cold_61();
LAB_00103a6a:
    main_cold_60();
LAB_00103a6f:
    main_cold_59();
LAB_00103a74:
    main_cold_8();
LAB_00103a79:
    main_cold_9();
LAB_00103a7e:
    main_cold_58();
LAB_00103a83:
    main_cold_57();
LAB_00103a88:
    main_cold_56();
LAB_00103a8d:
    main_cold_55();
LAB_00103a92:
    main_cold_54();
LAB_00103a97:
    main_cold_53();
LAB_00103a9c:
    main_cold_52();
LAB_00103aa1:
    main_cold_51();
LAB_00103aa6:
    main_cold_50();
LAB_00103aab:
    main_cold_49();
LAB_00103ab0:
    main_cold_48();
LAB_00103ab5:
    main_cold_47();
LAB_00103aba:
    main_cold_46();
LAB_00103abf:
    main_cold_45();
LAB_00103ac4:
    main_cold_10();
LAB_00103ac9:
    main_cold_11();
LAB_00103ace:
    main_cold_44();
LAB_00103ad3:
    main_cold_43();
LAB_00103ad8:
    main_cold_12();
LAB_00103add:
    main_cold_13();
LAB_00103ae2:
    main_cold_42();
LAB_00103ae7:
    main_cold_41();
LAB_00103aec:
    main_cold_14();
LAB_00103af1:
    main_cold_15();
LAB_00103af6:
    main_cold_40();
LAB_00103afb:
    main_cold_39();
LAB_00103b00:
    main_cold_16();
LAB_00103b05:
    main_cold_17();
LAB_00103b0a:
    main_cold_18();
LAB_00103b0f:
    main_cold_38();
LAB_00103b14:
    main_cold_37();
LAB_00103b19:
    main_cold_36();
LAB_00103b1e:
    main_cold_35();
LAB_00103b23:
    main_cold_34();
LAB_00103b28:
    main_cold_33();
LAB_00103b2d:
    main_cold_32();
LAB_00103b32:
    main_cold_31();
LAB_00103b37:
    main_cold_30();
LAB_00103b3c:
    main_cold_29();
LAB_00103b41:
    main_cold_19();
LAB_00103b46:
    main_cold_20();
LAB_00103b4b:
    main_cold_21();
LAB_00103b50:
    main_cold_22();
LAB_00103b55:
    main_cold_23();
LAB_00103b5a:
    main_cold_24();
LAB_00103b5f:
    main_cold_25();
LAB_00103b64:
    main_cold_26();
  }
  main_cold_27();
LAB_00103b6e:
  main_cold_28();
}

Assistant:

int main ()
{
    int rc;
    struct nn_trie trie;

    /*  Try matching with an empty trie. */
    nn_trie_init (&trie);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with "all" subscription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try some simple matching. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "DEF", 3);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDE", 5);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try a long subcsription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012456789", 10);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012345678901234567", 18);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try matching with a sparse node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ADE", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AD", 2);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with a dense node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "000", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "a", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "c", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Check prefix splitting and compaction. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDEF", 6);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Check whether there's no problem with removing all subscriptions. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);  

    /*  Check converting from sparse node to dense node and vice versa. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    return 0;
}